

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O1

void Saig_TsiPrintTraces(Saig_Tsim_t *p,int nWords,int nPrefix,int nLoop)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = p->pAig->nRegs;
  puts("Ternary traces for each flop:");
  printf("      : ");
  if (nLoop - p->vStates->nSize < -1) {
    uVar3 = 0;
    do {
      printf("%d",(ulong)(uint)((int)uVar3 + (int)(uVar3 / 10) * -10));
      uVar5 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar5;
    } while ((int)uVar5 < p->vStates->nSize + ~nLoop);
  }
  printf("  ");
  if (0 < nLoop) {
    uVar3 = 0;
    do {
      printf("%d",(ulong)(uint)((int)uVar3 + (int)(uVar3 / 10) * -10));
      uVar3 = (ulong)((int)uVar3 + 1);
      nLoop = nLoop + -1;
    } while (nLoop != 0);
  }
  putchar(10);
  if (0 < (int)uVar4) {
    uVar3 = 0;
    do {
      printf("%5d : ",uVar3);
      iVar1 = p->vStates->nSize;
      if (1 < iVar1) {
        uVar4 = (int)uVar3 * 2 & 0x1e;
        if (0 < iVar1) {
          pvVar2 = *p->vStates->pArray;
          (*(code *)(&DAT_00a32030 +
                    *(int *)(&DAT_00a32030 +
                            (ulong)((uint)((*(uint *)((long)pvVar2 + (uVar3 >> 4) * 4) >> uVar4 & 1)
                                          != 0) +
                                   (*(uint *)((long)pvVar2 + (uVar3 >> 4) * 4) >>
                                    ((char)uVar4 + 1U & 0x1f) & 1) * 2) * 4)))();
          return;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar5 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar5;
      putchar(10);
    } while (uVar5 != uVar4);
  }
  return;
}

Assistant:

void Saig_TsiPrintTraces( Saig_Tsim_t * p, int nWords, int nPrefix, int nLoop )
{
    unsigned * pState;
    int nRegs = p->pAig->nRegs;
    int Value, i, k, Counter = 0;
    printf( "Ternary traces for each flop:\n" );
    printf( "      : " );
    for ( i = 0; i < Vec_PtrSize(p->vStates) - nLoop - 1; i++ )
        printf( "%d", i%10 );
    printf( "  " );
    for ( i = 0; i < nLoop; i++ )
        printf( "%d", i%10 );
    printf( "\n" );
    for ( i = 0; i < nRegs; i++ )
    {
/*
        Vec_PtrForEachEntry( unsigned *, p->vStates, pState, k )
        {
            Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
            if ( Value == SAIG_XVSX )
                break;
        }
        if ( k == Vec_PtrSize(p->vStates) )
            Counter++;
        else
            continue;
*/

        // print trace
//        printf( "%5d : %5d %5d  ", Counter, i, Saig_ManLo(p->pAig, i)->Id );
        printf( "%5d : ", Counter++ );
        Vec_PtrForEachEntryStop( unsigned *, p->vStates, pState, k, Vec_PtrSize(p->vStates)-1 )
        {
            Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
            if ( Value == SAIG_XVS0 )
                printf( "0" );
            else if ( Value == SAIG_XVS1 )
                printf( "1" );
            else if ( Value == SAIG_XVSX )
                printf( "x" );
            else
                assert( 0 );
            if ( k == nPrefix - 1 )
                printf( "  " );
        }
        printf( "\n" );
    }
}